

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSectionedSpine,_3UL>::Construct
                   (DB *db,LIST *params)

{
  IfcSectionedSpine *in;
  
  in = (IfcSectionedSpine *)operator_new(0x80);
  *(undefined8 *)&in->field_0x70 = 0;
  *(char **)&in->field_0x78 = "IfcSectionedSpine";
  *(undefined8 *)&(in->super_IfcGeometricRepresentationItem).field_0x28 = 0;
  (in->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcSectionedSpine_00949bb0;
  *(undefined ***)&in->field_0x68 = &PTR__IfcSectionedSpine_00949c28;
  *(undefined ***)
   &(in->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcSectionedSpine_00949bd8;
  *(undefined ***)
   &(in->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcSectionedSpine_00949c00;
  *(undefined8 *)&(in->super_IfcGeometricRepresentationItem).field_0x30 = 0;
  (in->CrossSections).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in->CrossSections).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in->CrossSections).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in->CrossSectionPositions).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in->CrossSectionPositions).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in->CrossSectionPositions).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcSectionedSpine>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }